

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddFile
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          FileDescriptorProto *file,FileDescriptorProto *value)

{
  int iVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  LogMessage *pLVar5;
  Type *pTVar6;
  Type *pTVar7;
  Type *pTVar8;
  Type *pTVar9;
  int i;
  int iVar10;
  int i_2;
  FileDescriptorProto *value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  RepeatedPtrFieldBase *local_70;
  string path;
  
  value_local = value;
  bVar3 = InsertIfNotPresent<std::map<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>>
                    (&this->by_name_,
                     (first_type *)((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                     &value_local);
  if (!bVar3) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&path,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x78);
    pLVar5 = internal::LogMessage::operator<<
                       ((LogMessage *)&path,"File already exists in database: ");
    pLVar5 = internal::LogMessage::operator<<
                       (pLVar5,(string *)
                               ((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar5);
    internal::LogMessage::~LogMessage((LogMessage *)&path);
    return false;
  }
  if (((file->_has_bits_).has_bits_[0] & 2) == 0) {
    path._M_dataplus._M_p = (pointer)&path.field_2;
    path._M_string_length = 0;
    path.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string
              ((string *)&path,
               (string *)((ulong)(file->package_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    if (path._M_string_length != 0) {
      std::__cxx11::string::push_back((char)&path);
    }
  }
  iVar10 = 0;
  do {
    if ((file->message_type_).super_RepeatedPtrFieldBase.current_size_ <= iVar10) {
      iVar10 = 0;
      goto LAB_00389373;
    }
    pTVar6 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                       (&(file->message_type_).super_RepeatedPtrFieldBase,iVar10);
    std::operator+(&local_90,&path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(pTVar6->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    bVar3 = AddSymbol(this,&local_90,value_local);
    std::__cxx11::string::~string((string *)&local_90);
    if (!bVar3) break;
    pvVar2 = (file->name_).tagged_ptr_.ptr_;
    pTVar6 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                       (&(file->message_type_).super_RepeatedPtrFieldBase,iVar10);
    bVar3 = AddNestedExtensions(this,(string *)((ulong)pvVar2 & 0xfffffffffffffffe),pTVar6,
                                value_local);
    iVar10 = iVar10 + 1;
  } while (bVar3);
  goto LAB_0038943f;
  while( true ) {
    pTVar7 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                       (&(file->enum_type_).super_RepeatedPtrFieldBase,iVar10);
    std::operator+(&local_90,&path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(pTVar7->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    bVar3 = AddSymbol(this,&local_90,value_local);
    std::__cxx11::string::~string((string *)&local_90);
    iVar10 = iVar10 + 1;
    if (!bVar3) break;
LAB_00389373:
    if ((file->enum_type_).super_RepeatedPtrFieldBase.current_size_ <= iVar10) {
      iVar10 = 0;
      goto LAB_003893c8;
    }
  }
  goto LAB_0038943f;
  while( true ) {
    pTVar9 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                       (local_70,iVar10);
    std::operator+(&local_90,&path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(pTVar9->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    bVar4 = AddSymbol(this,&local_90,value_local);
    std::__cxx11::string::~string((string *)&local_90);
    iVar10 = iVar10 + 1;
    if (!bVar4) break;
LAB_0038946d:
    iVar1 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
    bVar3 = iVar1 <= iVar10;
    if (iVar1 <= iVar10) break;
  }
  goto LAB_00389441;
  while( true ) {
    pvVar2 = (file->name_).tagged_ptr_.ptr_;
    pTVar8 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(file->extension_).super_RepeatedPtrFieldBase,iVar10);
    bVar3 = AddExtension(this,(string *)((ulong)pvVar2 & 0xfffffffffffffffe),pTVar8,value_local);
    iVar10 = iVar10 + 1;
    if (!bVar3) break;
LAB_003893c8:
    if ((file->extension_).super_RepeatedPtrFieldBase.current_size_ <= iVar10) {
      local_70 = &(file->service_).super_RepeatedPtrFieldBase;
      iVar10 = 0;
      goto LAB_0038946d;
    }
    pTVar8 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(file->extension_).super_RepeatedPtrFieldBase,iVar10);
    std::operator+(&local_90,&path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(pTVar8->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    bVar3 = AddSymbol(this,&local_90,value_local);
    std::__cxx11::string::~string((string *)&local_90);
    if (!bVar3) break;
  }
LAB_0038943f:
  bVar3 = false;
LAB_00389441:
  std::__cxx11::string::~string((string *)&path);
  return bVar3;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file, Value value) {
  if (!InsertIfNotPresent(&by_name_, file.name(), value)) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  std::string path = file.has_package() ? file.package() : std::string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.name(), file.message_type(i), value))
      return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.name(), file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}